

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkStats.h
# Opt level: O2

void Corrade::TestSuite::Implementation::printStats
               (Debug *out,double mean,double stddev,Color color,BenchmarkUnits unit)

{
  undefined8 uVar1;
  char *unit_00;
  double multiplier;
  Debug local_30 [40];
  
  switch(unit) {
  case Nanoseconds:
    printTime(out,mean,stddev,color);
    return;
  case Cycles:
    unit_00 = "C";
    break;
  case Instructions:
    unit_00 = "I";
    break;
  case Bytes:
    unit_00 = "B";
    multiplier = 1024.0;
    goto LAB_00110375;
  case Count:
    unit_00 = " ";
    break;
  case RatioThousandths:
    multiplier = 1000.0;
    mean = mean / 1000.0;
    stddev = stddev / 1000.0;
    unit_00 = " ";
    goto LAB_00110375;
  case PercentageThousandths:
    multiplier = 1000.0;
    mean = mean / 1000.0;
    stddev = stddev / 1000.0;
    unit_00 = "%";
    goto LAB_00110375;
  default:
    uVar1 = Corrade::Utility::Error::defaultOutput();
    Corrade::Utility::Error::Error((Error *)local_30,uVar1,0);
    Corrade::Utility::Debug::operator<<
              (local_30,
               "Reached unreachable code at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/TestSuite/Implementation/BenchmarkStats.h:150"
              );
    Corrade::Utility::Error::~Error((Error *)local_30);
    abort();
  }
  multiplier = 1000.0;
LAB_00110375:
  printCount(out,mean,stddev,color,multiplier,unit_00);
  return;
}

Assistant:

inline void printStats(Utility::Debug& out, const double mean, const double stddev, const Utility::Debug::Color color, const Tester::BenchmarkUnits unit) {
    switch(unit) {
        case Tester::BenchmarkUnits::Nanoseconds:
            printTime(out, mean, stddev, color);
            return;
        case Tester::BenchmarkUnits::Cycles:
            printCount(out, mean, stddev, color, 1000.0, "C");
            return;
        case Tester::BenchmarkUnits::Instructions:
            printCount(out, mean, stddev, color, 1000.0, "I");
            return;
        case Tester::BenchmarkUnits::Bytes:
            printCount(out, mean, stddev, color, 1024.0, "B");
            return;
        case Tester::BenchmarkUnits::Count:
            printCount(out, mean, stddev, color, 1000.0, " ");
            return;
        case Tester::BenchmarkUnits::RatioThousandths:
            printCount(out, mean/1000.0, stddev/1000.0, color, 1000.0, " ");
            return;
        case Tester::BenchmarkUnits::PercentageThousandths:
            printCount(out, mean/1000.0, stddev/1000.0, color, 1000.0, "%");
            return;
    }

    CORRADE_INTERNAL_ASSERT_UNREACHABLE(); /* LCOV_EXCL_LINE */
}